

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_sqrt_ppc64(float64 xa,float_status *s)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float64 fVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  FloatParts FVar11;
  
  FVar11 = float64_unpack_raw(xa);
  FVar11 = sf_canonicalize(FVar11,&float64_params,s);
  if (((undefined1  [16])FVar11 & (undefined1  [16])0xfc00000000) == (undefined1  [16])0x0) {
    uVar6 = FVar11._12_4_ & 3;
    if (uVar6 != 1) {
      if ((FVar11._8_8_ >> 0x28 & 1) == 0) {
        if (uVar6 == 2) {
          uVar4 = FVar11.frac >> (~(byte)FVar11.exp & 1);
          uVar7 = 0x3e;
          lVar8 = 0;
          lVar9 = 0;
          do {
            uVar7 = uVar7 - 1;
            uVar10 = 1L << ((byte)uVar7 & 0x3f);
            uVar1 = uVar10 + lVar9;
            uVar2 = 0;
            uVar3 = 0;
            if (uVar1 <= uVar4) {
              lVar9 = uVar1 + uVar10;
              uVar2 = uVar1;
              uVar3 = uVar10;
            }
            lVar8 = lVar8 + uVar3;
            uVar4 = (uVar4 - uVar2) * 2;
          } while (6 < uVar7);
          uVar7 = FVar11._8_8_ & 0xfffffe0300000000 | (ulong)(uint)(FVar11.exp >> 1);
          FVar11.exp = (int)uVar7;
          FVar11.cls = (char)(uVar7 >> 0x20);
          FVar11.sign = (_Bool)(char)(uVar7 >> 0x28);
          FVar11._14_2_ = (short)(uVar7 >> 0x30);
          FVar11.frac = (ulong)(uVar4 != 0) + lVar8 * 2;
        }
        else if (uVar6 != 3) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
      }
      else {
        s->float_exception_flags = s->float_exception_flags | 1;
        FVar11.exp = 0x7fffffff;
        FVar11.cls = float_class_qnan;
        FVar11.sign = false;
        FVar11._14_2_ = 0;
        FVar11.frac = 0x2000000000000000;
      }
    }
  }
  else {
    FVar11 = return_nan(FVar11,s);
  }
  FVar11 = round_canonical(FVar11,s,&float64_params);
  fVar5 = float64_pack_raw(FVar11);
  return fVar5;
}

Assistant:

float64 QEMU_FLATTEN float64_sqrt(float64 xa, float_status *s)
{
    union_float64 ua, ur;

    ua.s = xa;
    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float64_input_flush1(&ua.s, s);
    if (QEMU_HARDFLOAT_1F64_USE_FP) {
        if (unlikely(!(fpclassify(ua.h) == FP_NORMAL ||
                       fpclassify(ua.h) == FP_ZERO) ||
                     signbit(ua.h))) {
            goto soft;
        }
    } else if (unlikely(!float64_is_zero_or_normal(ua.s) ||
                        float64_is_neg(ua.s))) {
        goto soft;
    }
    ur.h = sqrt(ua.h);
    return ur.s;

 soft:
    return soft_f64_sqrt(ua.s, s);
}